

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorBits.c
# Opt level: O3

void InsertVarsWithoutClearing(Cube *pC,int *pVars,int nVarsIn,int *pVarValues,int Output)

{
  int iVar1;
  ulong uVar2;
  
  if ((nVarsIn < 1) || (g_CoverInfo.nVarsIn < nVarsIn)) {
    __assert_fail("nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorBits.c"
                  ,0x194,"void InsertVarsWithoutClearing(Cube *, int *, int, int *, int)");
  }
  uVar2 = 0;
  do {
    iVar1 = pVars[uVar2];
    if ((iVar1 < 0) || (g_CoverInfo.nVarsIn <= iVar1)) {
      __assert_fail("pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorBits.c"
                    ,0x197,"void InsertVarsWithoutClearing(Cube *, int *, int, int *, int)");
    }
    if (2 < pVarValues[uVar2] - 1U) {
      __assert_fail("pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorBits.c"
                    ,0x198,"void InsertVarsWithoutClearing(Cube *, int *, int, int *, int)");
    }
    pC->pCubeDataIn[iVar1 * 2 >> 5] =
         pC->pCubeDataIn[iVar1 * 2 >> 5] | pVarValues[uVar2] << ((byte)(iVar1 * 2) & 0x1f);
    uVar2 = uVar2 + 1;
  } while ((uint)nVarsIn != uVar2);
  pC->pCubeDataOut[Output >> 5] = pC->pCubeDataOut[Output >> 5] | 1 << ((byte)Output & 0x1f);
  return;
}

Assistant:

void InsertVarsWithoutClearing( Cube * pC, int * pVars, int nVarsIn, int * pVarValues, int Output )
// corrects the given number of variables (nVarsIn) in pC->pCubeDataIn[]
// variable numbers are given in pVarNumbers[], their values are in pVarValues[]
// arrays pVarNumbers[] and pVarValues[] are provided by the user
{
    int GlobalBit;
    int LocalWord;
    int LocalBit;
    int i;
    assert( nVarsIn > 0 && nVarsIn <= g_CoverInfo.nVarsIn );
    for ( i = 0; i < nVarsIn; i++ )
    {
        assert( pVars[i] >= 0 && pVars[i] < g_CoverInfo.nVarsIn );
        assert( pVarValues[i] == VAR_NEG || pVarValues[i] == VAR_POS || pVarValues[i] == VAR_ABS );
        GlobalBit = (pVars[i]<<1);
        LocalWord = VarWord(GlobalBit);
        LocalBit  = VarBit(GlobalBit);

        // correct this variables
        pC->pCubeDataIn[LocalWord] |= ( pVarValues[i] << LocalBit );
    }
    // insert the output bit
    pC->pCubeDataOut[VarWord(Output)] |= ( 1 << VarBit(Output) );
}